

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInApi::cancelCallback(MidiInApi *this)

{
  string *this_00;
  string local_30;
  MidiInApi *local_10;
  MidiInApi *this_local;
  
  if (((this->inputData_).usingCallback & 1U) == 0) {
    this_00 = &(this->super_MidiApi).errorString_;
    local_10 = this;
    std::__cxx11::string::operator=
              ((string *)this_00,"RtMidiIn::cancelCallback: no callback function was set!");
    std::__cxx11::string::string((string *)&local_30,(string *)this_00);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (this->inputData_).userCallback = (RtMidiCallback)0x0;
    (this->inputData_).userData = (void *)0x0;
    (this->inputData_).usingCallback = false;
  }
  return;
}

Assistant:

void MidiInApi :: cancelCallback()
{
  if ( !inputData_.usingCallback ) {
    errorString_ = "RtMidiIn::cancelCallback: no callback function was set!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  inputData_.userCallback = 0;
  inputData_.userData = 0;
  inputData_.usingCallback = false;
}